

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_caution_phase(wchar_t emergency,wchar_t turns)

{
  loc grid1;
  int iVar1;
  int iVar2;
  _Bool _Var3;
  uint32_t uVar4;
  wchar_t wVar5;
  loc grid2;
  char *pcVar6;
  borg_grid *local_40;
  borg_grid *ag;
  wchar_t min;
  wchar_t dis;
  wchar_t p;
  wchar_t y;
  wchar_t x;
  wchar_t d;
  wchar_t i;
  wchar_t k;
  wchar_t n;
  wchar_t turns_local;
  wchar_t emergency_local;
  
  local_40 = borg_grids[borg.c.y] + borg.c.x;
  if (borg.trait[0xd2] == 0) {
    turns_local._3_1_ = false;
  }
  else {
    i = L'\0';
    for (d = L'\0'; d < L'd'; d = d + L'\x01') {
      for (x = L'\0'; x < L'd'; x = x + L'\x01') {
        do {
          do {
            iVar2 = borg.c.y;
            uVar4 = Rand_div(0x15);
            iVar1 = borg.c.x;
            dis = iVar2 + uVar4 + L'\xfffffff6';
            uVar4 = Rand_div(0x15);
            p = iVar1 + uVar4 + L'\xfffffff6';
            grid2 = loc(p,dis);
            grid1.y = borg.c.y;
            grid1.x = borg.c.x;
            wVar5 = distance(grid1,grid2);
          } while (wVar5 < L'\x05');
        } while (L'\n' < wVar5);
        if (((((L'\0' < dis) && (dis < L'A')) && (L'\0' < p)) &&
            ((p < L'Å' && (local_40 = borg_grids[dis] + p, local_40->feat != '\0')))) &&
           ((_Var3 = borg_cave_floor_bold(dis,p), _Var3 &&
            ((local_40->kill == '\0' && ((local_40->web & 1U) == 0)))))) break;
      }
      if ((local_40->feat == '\0') && (borg.trait[0x1c] < 0x1e)) {
        i = i + L'\x01';
      }
      else if (x < L'd') {
        wVar5 = borg_danger(dis,p,turns,true,false);
        if (borg.trait[0x1b] < wVar5) {
          i = i + L'\x01';
        }
      }
      else {
        i = i + L'\x01';
      }
    }
    if (emergency < i) {
      pcVar6 = format("# No Phase. scary squares: %d",(ulong)(uint)i);
      borg_note(pcVar6);
      turns_local._3_1_ = false;
    }
    else {
      pcVar6 = format("# Safe to Phase. scary squares: %d",(ulong)(uint)i);
      borg_note(pcVar6);
      turns_local._3_1_ = true;
    }
  }
  return turns_local._3_1_;
}

Assistant:

bool borg_caution_phase(int emergency, int turns)
{
    int n, k, i, d, x, y, p;

    int dis       = 10;
    int min       = dis / 2;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    /* must have the ability */
    if (!borg.trait[BI_APHASE])
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 1))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 1))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids */
            if (ag->feat == FEAT_NONE)
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Skip webs */
            if (ag->web)
                continue;

            /* Stop looking */
            break;
        }

        /* If low level, unknown squares are scary */
        if (ag->feat == FEAT_NONE && borg.trait[BI_MAXHP] < 30) {
            n++;
            continue;
        }

        /* No location */
        /* in the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but may be dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine */
        p = borg_danger(y, x, turns, true, false);

        /* if *very* scary, do not allow jumps at all */
        if (p > borg.trait[BI_CURHP])
            n++;
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Phase. scary squares: %d", n));
        return false;
    } else
        borg_note(format("# Safe to Phase. scary squares: %d", n));

    /* Okay */
    return true;
}